

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlAutomataPtr xmlNewAutomata(void)

{
  xmlRegParserCtxtPtr ctxt;
  xmlRegStatePtr pxVar1;
  
  ctxt = (xmlRegParserCtxtPtr)(*xmlMalloc)(0x78);
  if (ctxt == (xmlRegParserCtxtPtr)0x0) {
    ctxt = (xmlRegParserCtxtPtr)0x0;
  }
  else {
    ctxt->counters = (xmlRegCounter *)0x0;
    ctxt->determinist = 0;
    ctxt->negs = 0;
    ctxt->states = (xmlRegStatePtr *)0x0;
    ctxt->maxCounters = 0;
    ctxt->nbCounters = 0;
    ctxt->atoms = (xmlRegAtomPtr *)0x0;
    ctxt->maxStates = 0;
    ctxt->nbStates = 0;
    ctxt->atom = (xmlRegAtomPtr)0x0;
    ctxt->maxAtoms = 0;
    ctxt->nbAtoms = 0;
    ctxt->end = (xmlRegStatePtr)0x0;
    ctxt->state = (xmlRegStatePtr)0x0;
    ctxt->error = 0;
    ctxt->neg = 0;
    ctxt->start = (xmlRegStatePtr)0x0;
    ctxt->string = (xmlChar *)0x0;
    ctxt->cur = (xmlChar *)0x0;
    ctxt->flags = 0;
    ctxt->depth = 0;
    ctxt->determinist = -1;
  }
  if (ctxt != (xmlRegParserCtxtPtr)0x0) {
    pxVar1 = xmlRegStatePush(ctxt);
    ctxt->state = pxVar1;
    if (pxVar1 != (xmlRegStatePtr)0x0) {
      ctxt->start = pxVar1;
      ctxt->end = (xmlRegStatePtr)0x0;
      pxVar1->type = XML_REGEXP_START_STATE;
      ctxt->flags = 0;
      return ctxt;
    }
    xmlRegFreeParserCtxt(ctxt);
  }
  return (xmlAutomataPtr)0x0;
}

Assistant:

xmlAutomataPtr
xmlNewAutomata(void) {
    xmlAutomataPtr ctxt;

    ctxt = xmlRegNewParserCtxt(NULL);
    if (ctxt == NULL)
	return(NULL);

    /* initialize the parser */
    ctxt->state = xmlRegStatePush(ctxt);
    if (ctxt->state == NULL) {
	xmlFreeAutomata(ctxt);
	return(NULL);
    }
    ctxt->start = ctxt->state;
    ctxt->end = NULL;

    ctxt->start->type = XML_REGEXP_START_STATE;
    ctxt->flags = 0;

    return(ctxt);
}